

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O1

void __thiscall QProcessPrivate::~QProcessPrivate(QProcessPrivate *this)

{
  QProcessPrivate *pQVar1;
  UnixExtras *__ptr;
  Data *pDVar2;
  
  (this->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QProcessPrivate_006b0c50;
  pQVar1 = (this->stdinChannel).process;
  if (pQVar1 != (QProcessPrivate *)0x0) {
    Channel::clear(&pQVar1->stdoutChannel);
  }
  pQVar1 = (this->stdoutChannel).process;
  if (pQVar1 != (QProcessPrivate *)0x0) {
    Channel::clear(&pQVar1->stdinChannel);
  }
  __ptr = (this->unixExtras)._M_t.
          super___uniq_ptr_impl<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
          ._M_t.
          super__Tuple_impl<0UL,_QProcessPrivate::UnixExtras_*,_std::default_delete<QProcessPrivate::UnixExtras>_>
          .super__Head_base<0UL,_QProcessPrivate::UnixExtras_*,_false>._M_head_impl;
  if (__ptr != (UnixExtras *)0x0) {
    std::default_delete<QProcessPrivate::UnixExtras>::operator()
              ((default_delete<QProcessPrivate::UnixExtras> *)&this->unixExtras,__ptr);
  }
  (this->unixExtras)._M_t.
  super___uniq_ptr_impl<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
  ._M_t.
  super__Tuple_impl<0UL,_QProcessPrivate::UnixExtras_*,_std::default_delete<QProcessPrivate::UnixExtras>_>
  .super__Head_base<0UL,_QProcessPrivate::UnixExtras_*,_false>._M_head_impl = (UnixExtras *)0x0;
  QProcessEnvironment::~QProcessEnvironment(&this->environment);
  pDVar2 = (this->workingDirectory).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->workingDirectory).d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->arguments).d);
  pDVar2 = (this->program).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->program).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->stderrChannel).file.d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> +
         -1);
    UNLOCK();
    if ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0)
    {
      QArrayData::deallocate(&((this->stderrChannel).file.d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->stdoutChannel).file.d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> +
         -1);
    UNLOCK();
    if ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0)
    {
      QArrayData::deallocate(&((this->stdoutChannel).file.d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->stdinChannel).file.d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> +
         -1);
    UNLOCK();
    if ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0)
    {
      QArrayData::deallocate(&((this->stdinChannel).file.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIODevicePrivate::~QIODevicePrivate(&this->super_QIODevicePrivate);
  return;
}

Assistant:

QProcessPrivate::~QProcessPrivate()
{
    if (stdinChannel.process)
        stdinChannel.process->stdoutChannel.clear();
    if (stdoutChannel.process)
        stdoutChannel.process->stdinChannel.clear();
}